

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O0

void __thiscall iqxmlrpc::Binary_data::Binary_data(Binary_data *this,string *s,bool raw)

{
  bool raw_local;
  string *s_local;
  Binary_data *this_local;
  
  Value_type::Value_type(&this->super_Value_type);
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Binary_data_00254df8;
  std::__cxx11::string::string((string *)&this->data);
  std::__cxx11::string::string((string *)&this->base64);
  if (raw) {
    std::__cxx11::string::operator=((string *)&this->data,(string *)s);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->base64,(string *)s);
    decode(this);
  }
  return;
}

Assistant:

Binary_data::Binary_data( const std::string& s, bool raw )
{
  if( raw )
    data = s;
  else
  {
    base64 = s;
    decode();
  }
}